

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImgDisplay * __thiscall
cimg_library::CImgDisplay::assign
          (CImgDisplay *this,uint dimw,uint dimh,char *title,uint normalization_type,
          bool fullscreen_flag,bool closed_flag)

{
  void *__s;
  int iVar1;
  long lVar2;
  CImgDisplay *pCVar3;
  
  if (dimw != 0 && dimh != 0) {
    _assign(this,dimw,dimh,title,normalization_type,fullscreen_flag,closed_flag);
    this->_min = 0.0;
    this->_max = 0.0;
    __s = this->_data;
    if (cimg::X11_attr()::val == '\0') {
      iVar1 = __cxa_guard_acquire(&cimg::X11_attr()::val);
      if (iVar1 != 0) {
        cimg::X11_static::X11_static(&cimg::X11_attr::val);
        __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
        __cxa_guard_release(&cimg::X11_attr()::val);
      }
    }
    lVar2 = 1;
    if (cimg::X11_attr::val.nb_bits != 8) {
      if (cimg::X11_attr()::val == '\0') {
        iVar1 = __cxa_guard_acquire(&cimg::X11_attr()::val);
        if (iVar1 != 0) {
          cimg::X11_static::X11_static(&cimg::X11_attr::val);
          __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
          __cxa_guard_release(&cimg::X11_attr()::val);
        }
      }
      lVar2 = (ulong)(cimg::X11_attr::val.nb_bits != 0x10) * 2 + 2;
    }
    memset(__s,0,(ulong)this->_height * (ulong)this->_width * lVar2);
    pCVar3 = paint(this,true);
    return pCVar3;
  }
  pCVar3 = assign(this);
  return pCVar3;
}

Assistant:

CImgDisplay& assign(const unsigned int dimw, const unsigned int dimh, const char *const title=0,
                        const unsigned int normalization_type=3,
                        const bool fullscreen_flag=false, const bool closed_flag=false) {
      if (!dimw || !dimh) return assign();
      _assign(dimw,dimh,title,normalization_type,fullscreen_flag,closed_flag);
      _min = _max = 0;
      std::memset(_data,0,(cimg::X11_attr().nb_bits==8?sizeof(unsigned char):
                           (cimg::X11_attr().nb_bits==16?sizeof(unsigned short):sizeof(unsigned int)))*
                  (size_t)_width*_height);
      return paint();
    }